

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  byte *pbVar5;
  ValueHolder VVar6;
  CommentInfo *pCVar7;
  ptrdiff_t pVar8;
  ptrdiff_t pVar9;
  ptrdiff_t pVar10;
  bool bVar11;
  ulong uVar12;
  ulong value;
  byte *pbVar13;
  Value *this_00;
  ulong uVar14;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  pbVar5 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar12 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar13 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar13 < pbVar5) {
    value = 0;
    do {
      bVar2 = *pbVar13;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0011c5ae:
        bVar11 = decodeDouble(this,token,decoded);
        return bVar11;
      }
      pbVar13 = pbVar13 + 1;
      uVar14 = (ulong)(bVar2 - 0x30);
      if ((uVar12 / 10 <= value) &&
         (((uVar12 / 10 < value || (pbVar13 != pbVar5)) || (uVar12 % 10 < uVar14))))
      goto LAB_0011c5ae;
      value = uVar14 + value * 10;
    } while (pbVar13 < pbVar5);
    if ((cVar1 == '-') && (value == uVar12)) {
      this_00 = &local_48;
      value = 0x8000000000000000;
    }
    else {
      if (cVar1 == '-') goto LAB_0011c5a4;
      if (0x7fffffff < value) {
        this_00 = &local_c0;
        Value::Value(this_00,value);
        goto LAB_0011c5e5;
      }
LAB_0011c5d5:
      this_00 = &local_98;
    }
  }
  else {
    value = 0;
    if (cVar1 != '-') goto LAB_0011c5d5;
LAB_0011c5a4:
    value = -value;
    this_00 = &local_70;
  }
  Value::Value(this_00,value);
LAB_0011c5e5:
  uVar3 = *(ushort *)&decoded->field_0x8;
  uVar4 = *(ushort *)&this_00->field_0x8;
  VVar6 = decoded->value_;
  decoded->value_ = this_00->value_;
  this_00->value_ = VVar6;
  *(ushort *)&decoded->field_0x8 = uVar4 & 0x1ff | uVar3 & 0xfe00;
  *(ushort *)&this_00->field_0x8 = uVar3 & 0x1ff | uVar4 & 0xfe00;
  pCVar7 = decoded->comments_;
  decoded->comments_ = this_00->comments_;
  this_00->comments_ = pCVar7;
  pVar8 = this_00->limit_;
  pVar9 = decoded->start_;
  pVar10 = decoded->limit_;
  decoded->start_ = this_00->start_;
  decoded->limit_ = pVar8;
  this_00->start_ = pVar9;
  this_00->limit_ = pVar10;
  Value::~Value(this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}